

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int my_aio_write(aiocb *aiocbp)

{
  int iVar1;
  size_t sVar2;
  undefined8 *in_RDI;
  
  iVar1 = fseek((FILE *)*in_RDI,in_RDI[1],0);
  if (iVar1 == 0) {
    sVar2 = fwrite((void *)in_RDI[2],1,in_RDI[3],(FILE *)*in_RDI);
    if (sVar2 == in_RDI[3]) {
      *(undefined4 *)(in_RDI + 4) = 0;
      goto LAB_00106863;
    }
  }
  *(undefined4 *)(in_RDI + 4) = 0xffffffff;
LAB_00106863:
  return *(int *)(in_RDI + 4);
}

Assistant:

int my_aio_write(struct aiocb *aiocbp)
{
   if( (MYFSEEK(aiocbp->aio_fildes, (size_t)aiocbp->aio_offset, SEEK_SET) == 0)
   &&  (fwrite(aiocbp->aio_buf, 1, aiocbp->aio_nbytes, aiocbp->aio_fildes)
       == aiocbp->aio_nbytes) )
   {
      aiocbp->aio_lio_opcode = 0;
   }
   else
   {
      aiocbp->aio_lio_opcode = -1;
   }

   return(aiocbp->aio_lio_opcode);
}